

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall ON_3dmView::Default(ON_3dmView *this)

{
  view_projection vVar1;
  ON_3dVector local_40;
  ON_3dVector local_28;
  ON_3dmView *local_10;
  ON_3dmView *this_local;
  
  local_10 = this;
  ON_wString::Destroy(&this->m_name);
  ON_Viewport::operator=(&this->m_vp,&ON_Viewport::DefaultTopViewYUp);
  ON_3dmConstructionPlane::Default(&this->m_cplane);
  (this->m_display_mode_id).Data1 = 0;
  (this->m_display_mode_id).Data2 = 0;
  (this->m_display_mode_id).Data3 = 0;
  (this->m_display_mode_id).Data4[0] = '\0';
  (this->m_display_mode_id).Data4[1] = '\0';
  (this->m_display_mode_id).Data4[2] = '\0';
  (this->m_display_mode_id).Data4[3] = '\0';
  (this->m_display_mode_id).Data4[4] = '\0';
  (this->m_display_mode_id).Data4[5] = '\0';
  (this->m_display_mode_id).Data4[6] = '\0';
  (this->m_display_mode_id).Data4[7] = '\0';
  this->m_view_type = model_view_type;
  ON_3dmViewPosition::Default(&this->m_position);
  vVar1 = ON_Viewport::Projection(&this->m_vp);
  if (vVar1 == parallel_view) {
    ON_Viewport::CameraX(&local_28,&this->m_vp);
    ON_Viewport::CameraY(&local_40,&this->m_vp);
    ON_Plane::CreateFromFrame
              (&(this->m_cplane).m_plane,(ON_3dPoint *)&this->m_cplane,&local_28,&local_40);
  }
  this->m_bShowConstructionGrid = true;
  this->m_bShowConstructionAxes = true;
  this->m_bShowWorldAxes = true;
  this->m_bShowConstructionZAxis = false;
  ON_3dmViewTraceImage::Default(&this->m_trace_image);
  ON_3dmWallpaperImage::Default(&this->m_wallpaper_image);
  ON_3dmPageSettings::Default(&this->m_page_settings);
  (this->m_named_view_id).Data1 = 0;
  (this->m_named_view_id).Data2 = 0;
  (this->m_named_view_id).Data3 = 0;
  (this->m_named_view_id).Data4[0] = '\0';
  (this->m_named_view_id).Data4[1] = '\0';
  (this->m_named_view_id).Data4[2] = '\0';
  (this->m_named_view_id).Data4[3] = '\0';
  (this->m_named_view_id).Data4[4] = '\0';
  (this->m_named_view_id).Data4[5] = '\0';
  (this->m_named_view_id).Data4[6] = '\0';
  (this->m_named_view_id).Data4[7] = '\0';
  this->m_bLockedProjection = false;
  this->m_dFocalBlurDistance = 100.0;
  this->m_dFocalBlurAperture = 64.0;
  this->m_dFocalBlurJitter = 0.1;
  this->m_uFocalBlurSampleCount = 10;
  this->m_FocalBlurMode = None;
  (this->m_sizeRendering).cx = 0x280;
  (this->m_sizeRendering).cy = 0x1e0;
  return;
}

Assistant:

void ON_3dmView::Default()
{
  m_name.Destroy();

  m_vp = ON_Viewport::DefaultTopViewYUp;

  m_cplane.Default();
  m_display_mode_id = ON_nil_uuid;
  m_view_type = ON::model_view_type;
  m_position.Default();
  if ( m_vp.Projection() == ON::parallel_view ) {
    m_cplane.m_plane.CreateFromFrame( m_cplane.m_plane.origin, m_vp.CameraX(), m_vp.CameraY() );
  }
  m_bShowConstructionGrid = true;
  m_bShowConstructionAxes = true;
  m_bShowWorldAxes = true;
  m_bShowConstructionZAxis = false;

  m_trace_image.Default();
  m_wallpaper_image.Default();

  m_page_settings.Default();

  m_named_view_id = ON_nil_uuid;

  m_bLockedProjection = false;

  m_dFocalBlurDistance = 100.0;
  m_dFocalBlurAperture = 64.0;
  m_dFocalBlurJitter = 0.1;
  m_uFocalBlurSampleCount = 10;
  m_FocalBlurMode = ON_FocalBlurModes::None;
  m_sizeRendering.cx = 640;
  m_sizeRendering.cy = 480;
}